

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

_Bool scan_heredoc_end_identifier(Heredoc *heredoc,TSLexer *lexer)

{
  int32_t iVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  _Bool _Var5;
  uint local_1c;
  int32_t size;
  TSLexer *lexer_local;
  Heredoc *heredoc_local;
  
  reset_string(&heredoc->current_leading_word);
  local_1c = 0;
  if ((heredoc->delimiter).size != 0) {
    while( true ) {
      bVar4 = false;
      if ((lexer->lookahead != 0) && (bVar4 = false, lexer->lookahead != 10)) {
        if ((heredoc->delimiter).size <= local_1c) {
          __assert_fail("(uint32_t)(size) < (&heredoc->delimiter)->size",
                        "/workspace/llm4binary/github/license_c_cmakelists/tree-sitter[P]tree-sitter-bash/src/scanner.c"
                        ,0xe9,"_Bool scan_heredoc_end_identifier(Heredoc *, TSLexer *)");
        }
        bVar4 = false;
        if ((int)(heredoc->delimiter).contents[(int)local_1c] == lexer->lookahead) {
          bVar4 = (heredoc->current_leading_word).size < (heredoc->delimiter).size;
        }
      }
      if (!bVar4) break;
      _array__grow((Array *)&heredoc->current_leading_word,1,1);
      iVar1 = lexer->lookahead;
      uVar2 = (heredoc->current_leading_word).size;
      (heredoc->current_leading_word).size = uVar2 + 1;
      (heredoc->current_leading_word).contents[uVar2] = (char)iVar1;
      advance(lexer);
      local_1c = local_1c + 1;
    }
  }
  _array__grow((Array *)&heredoc->current_leading_word,1,1);
  uVar2 = (heredoc->current_leading_word).size;
  (heredoc->current_leading_word).size = uVar2 + 1;
  (heredoc->current_leading_word).contents[uVar2] = '\0';
  if ((heredoc->delimiter).size == 0) {
    _Var5 = false;
  }
  else {
    iVar3 = strcmp((heredoc->current_leading_word).contents,(heredoc->delimiter).contents);
    _Var5 = iVar3 == 0;
  }
  return _Var5;
}

Assistant:

static bool scan_heredoc_end_identifier(Heredoc *heredoc, TSLexer *lexer) {
    reset_string(&heredoc->current_leading_word);
    // Scan the first 'n' characters on this line, to see if they match the
    // heredoc delimiter
    int32_t size = 0;
    if (heredoc->delimiter.size > 0) {
        while (lexer->lookahead != '\0' && lexer->lookahead != '\n' &&
               (int32_t)*array_get(&heredoc->delimiter, size) == lexer->lookahead &&
               heredoc->current_leading_word.size < heredoc->delimiter.size) {
            array_push(&heredoc->current_leading_word, lexer->lookahead);
            advance(lexer);
            size++;
        }
    }
    array_push(&heredoc->current_leading_word, '\0');
    return heredoc->delimiter.size == 0
               ? false
               : strcmp(heredoc->current_leading_word.contents, heredoc->delimiter.contents) == 0;
}